

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

float * __thiscall ImVector<float>::erase_unsorted(ImVector<float> *this,float *it)

{
  float *pfVar1;
  float *pfVar2;
  int iVar3;
  long lVar4;
  
  pfVar2 = this->Data;
  if (pfVar2 <= it) {
    iVar3 = this->Size;
    pfVar1 = pfVar2 + iVar3;
    if (it < pfVar1) {
      lVar4 = (long)it - (long)pfVar2;
      if (it < pfVar1 + -1) {
        *(float *)((long)pfVar2 + lVar4) = pfVar1[-1];
        iVar3 = this->Size;
        pfVar2 = this->Data;
      }
      this->Size = iVar3 + -1;
      return (float *)((long)pfVar2 + lVar4);
    }
  }
  __assert_fail("it >= Data && it < Data+Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/./imgui/imgui.h"
                ,0x4f1,"T *ImVector<float>::erase_unsorted(const T *) [T = float]");
}

Assistant:

inline T*           erase_unsorted(const T* it)         { IM_ASSERT(it >= Data && it < Data+Size);  const ptrdiff_t off = it - Data; if (it < Data+Size-1) memcpy(Data + off, Data + Size - 1, sizeof(T)); Size--; return Data + off; }